

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Index __thiscall wabt::interp::Store::CopyRoot(Store *this,Index index)

{
  Ref *pRVar1;
  Index IVar2;
  Ref obj_index;
  Ref local_10;
  
  pRVar1 = FreeList<wabt::interp::Ref>::Get(&this->roots_,index);
  local_10.index = pRVar1->index;
  IVar2 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this->roots_,&local_10);
  return IVar2;
}

Assistant:

Store::RootList::Index Store::CopyRoot(RootList::Index index) {
  // roots_.Get() returns a reference to an element in an internal vector, and
  // roots_.New() might forward its arguments to emplace_back on the same
  // vector. This seems to "work" in most environments, but fails on Visual
  // Studio 2015 Win64. Copying it to a value fixes the issue.
  auto obj_index = roots_.Get(index);
  return roots_.New(obj_index);
}